

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_error.cpp
# Opt level: O2

string * __thiscall
pstore::json::error_category::message_abi_cxx11_
          (string *__return_storage_ptr__,error_category *this,int error)

{
  char *pcVar1;
  allocator local_9;
  
  if ((uint)error < 0xf) {
    pcVar1 = &DAT_00127bf8 + *(int *)(&DAT_00127bf8 + (ulong)(uint)error * 4);
  }
  else {
    pcVar1 = "unknown json::error_category error";
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,&local_9);
  return __return_storage_ptr__;
}

Assistant:

std::string pstore::json::error_category::message (int const error) const {
    auto * result = "unknown json::error_category error";
    switch (static_cast<error_code> (error)) {
    case error_code::none: result = "none"; break;
    case error_code::bad_unicode_code_point: result = "bad UNICODE code point"; break;
    case error_code::expected_array_member: result = "expected array member"; break;
    case error_code::expected_close_quote: result = "expected close quote"; break;
    case error_code::expected_colon: result = "expected colon"; break;
    case error_code::expected_digits: result = "expected digits"; break;
    case error_code::expected_object_member: result = "expected object member"; break;
    case error_code::expected_string: result = "expected string"; break;
    case error_code::expected_token: result = "expected token"; break;
    case error_code::invalid_escape_char: result = "invalid escape character"; break;
    case error_code::invalid_hex_char: result = "invalid hexadecimal escape character"; break;
    case error_code::number_out_of_range: result = "number out of range"; break;
    case error_code::unexpected_extra_input: result = "unexpected extra input"; break;
    case error_code::unrecognized_token: result = "unrecognized token"; break;
    case error_code::nesting_too_deep: result = "objects are too deeply nested"; break;
    }
    return result;
}